

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::IsReadyForCheckingDescriptorExtDecl
          (DescriptorPool *this,string_view message_name)

{
  initializer_list<const_char_*> iVar1;
  bool bVar2;
  int iVar3;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9b;
  key_equal local_9a;
  hasher local_99;
  char *local_98;
  char *pcStack_90;
  char *local_88;
  char *pcStack_80;
  char *local_78;
  char *pcStack_70;
  char *local_68;
  char *pcStack_60;
  char *local_58;
  char *pcStack_50;
  iterator local_40;
  size_type local_38;
  DescriptorPool *local_20;
  DescriptorPool *this_local;
  string_view message_name_local;
  
  message_name_local._M_len = (size_t)message_name._M_str;
  this_local = (DescriptorPool *)message_name._M_len;
  local_20 = this;
  if (IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)::
      kDescriptorTypes_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)
                                 ::kDescriptorTypes_abi_cxx11_);
    if (iVar3 != 0) {
      this_00 = (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)operator_new(0x20);
      local_58 = "google.protobuf.ServiceOptions";
      pcStack_50 = "google.protobuf.StreamOptions";
      local_68 = "google.protobuf.MethodOptions";
      pcStack_60 = "google.protobuf.OneofOptions";
      local_78 = "google.protobuf.FileOptions";
      pcStack_70 = "google.protobuf.MessageOptions";
      local_88 = "google.protobuf.ExtensionRangeOptions";
      pcStack_80 = "google.protobuf.FieldOptions";
      local_98 = "google.protobuf.EnumOptions";
      pcStack_90 = "google.protobuf.EnumValueOptions";
      local_40 = &local_98;
      local_38 = 10;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_9b);
      iVar1._M_len = local_38;
      iVar1._M_array = local_40;
      absl::lts_20240722::
      flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::raw_hash_set(this_00,iVar1,0,&local_99,&local_9a,&local_9b);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_9b);
      IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)::
      kDescriptorTypes_abi_cxx11_ = this_00;
      __cxa_guard_release(&IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)
                           ::kDescriptorTypes_abi_cxx11_);
    }
  }
  bVar2 = absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
          ::contains<std::basic_string_view<char,std::char_traits<char>>>
                    ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                      *)IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)
                        ::kDescriptorTypes_abi_cxx11_,
                     (key_arg<std::basic_string_view<char>_> *)&this_local);
  return bVar2;
}

Assistant:

bool DescriptorPool::IsReadyForCheckingDescriptorExtDecl(
    absl::string_view message_name) const {
  static const auto& kDescriptorTypes = *new absl::flat_hash_set<std::string>({
      "google.protobuf.EnumOptions",
      "google.protobuf.EnumValueOptions",
      "google.protobuf.ExtensionRangeOptions",
      "google.protobuf.FieldOptions",
      "google.protobuf.FileOptions",
      "google.protobuf.MessageOptions",
      "google.protobuf.MethodOptions",
      "google.protobuf.OneofOptions",
      "google.protobuf.ServiceOptions",
      "google.protobuf.StreamOptions",
  });
  return kDescriptorTypes.contains(message_name);
}